

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::CheckRuleHashes(cmGlobalGenerator *this)

{
  string *psVar1;
  string pfile;
  string home;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  psVar1 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  std::__cxx11::string::string((string *)&local_30,(string *)psVar1);
  cmStrCat<std::__cxx11::string&,char_const(&)[32]>
            (&local_50,&local_30,(char (*) [32])"/CMakeFiles/CMakeRuleHashes.txt");
  CheckRuleHashes(this,&local_50,&local_30);
  WriteRuleHashes(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmGlobalGenerator::CheckRuleHashes()
{
  std::string home = this->GetCMakeInstance()->GetHomeOutputDirectory();
  std::string pfile = cmStrCat(home, "/CMakeFiles/CMakeRuleHashes.txt");
  this->CheckRuleHashes(pfile, home);
  this->WriteRuleHashes(pfile);
}